

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O1

int comex_group_size(comex_group_t group,int *size)

{
  int code;
  comex_igroup_t *pcVar1;
  
  pcVar1 = comex_get_igroup_from_group(group);
  code = MPI_Group_size(pcVar1->group,size);
  if (code != 0) {
    comex_error("MPI_Group_size: Failed ",code);
  }
  return 0;
}

Assistant:

int comex_group_size(comex_group_t group, int *size)
{
    int status;

    comex_igroup_t *igroup = comex_get_igroup_from_group(group);
    status = MPI_Group_size(igroup->group, size);
    if (status != MPI_SUCCESS) {
        comex_error("MPI_Group_size: Failed ", status);
    }

    return COMEX_SUCCESS;
}